

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

int rw::Engine::open(char *__file,int __oflag,...)

{
  undefined8 *puVar1;
  int iVar2;
  ObjPipeline *pOVar3;
  undefined8 uVar4;
  int *piVar5;
  uint i;
  long lVar6;
  
  if ((engine == (undefined8 *)0x0) && (state == 1)) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp line: 254"
    ;
    engine = (undefined8 *)(*DAT_0014ada8)((long)s_plglist,0x40000);
    lVar6 = 0;
    *engine = 0;
    puVar1 = engine;
    engine[1] = 0;
    puVar1[4] = fopen;
    puVar1[5] = fclose;
    puVar1[6] = fseek;
    puVar1[7] = ftell;
    puVar1[8] = fread;
    puVar1[9] = fwrite;
    puVar1[10] = feof;
    memcpy(puVar1 + 0x18,null::renderdevice,0x88);
    (*(code *)puVar1[0x28])(2,__file,0);
    pOVar3 = ObjPipeline::create();
    engine[0x29] = pOVar3;
    piVar5 = (int *)&Driver::s_plglist;
    do {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp line: 282"
      ;
      uVar4 = (*DAT_0014ada8)((long)*piVar5,0x40000);
      engine[lVar6 + 0xb] = uVar4;
      *(undefined8 *)engine[lVar6 + 0xb] = engine[0x29];
      puVar1 = engine;
      *(code **)(engine[lVar6 + 0xb] + 0x10) = null::rasterCreate;
      *(code **)(puVar1[lVar6 + 0xb] + 0x18) = null::rasterLock;
      *(code **)(puVar1[lVar6 + 0xb] + 0x20) = null::rasterUnlock;
      *(code **)(puVar1[lVar6 + 0xb] + 0x28) = null::rasterLockPalette;
      *(code **)(puVar1[lVar6 + 0xb] + 0x30) = null::rasterUnlockPalette;
      *(code **)(puVar1[lVar6 + 0xb] + 0x38) = null::rasterNumLevels;
      *(code **)(puVar1[lVar6 + 0xb] + 0x40) = null::imageFindRasterFormat;
      *(code **)(puVar1[lVar6 + 0xb] + 0x48) = null::rasterFromImage;
      *(code **)(puVar1[lVar6 + 0xb] + 0x50) = null::rasterToImage;
      lVar6 = lVar6 + 1;
      piVar5 = piVar5 + 6;
    } while (lVar6 != 0xd);
    state = 2;
    iVar2 = 1;
  }
  else {
    open(__file,__oflag);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

bool32
Engine::open(EngineOpenParams *p)
{
	if(engine || Engine::state != Initialized){
		RWERROR((ERR_ENGINEOPEN));
		return 0;
	}

	// Allocate engine
	engine = (Engine*)rwNew(Engine::s_plglist.size, MEMDUR_GLOBAL);
	engine->currentCamera = nil;
	engine->currentWorld = nil;
	engine->filefuncs.rwfopen = (void *(*)(const char*, const char*))fopen;
	engine->filefuncs.rwfclose = (int (*)(void*))fclose;
	engine->filefuncs.rwfseek = (int (*)(void*, long, int))fseek;
	engine->filefuncs.rwftell = (long (*)(void*))ftell;
	engine->filefuncs.rwfread = (size_t (*)(void*, size_t, size_t, void*))fread;
	engine->filefuncs.rwfwrite = (size_t (*)(const void*, size_t, size_t, void*))fwrite;
	engine->filefuncs.rwfeof = (int (*)(void*))feof;

	// Initialize device
	// Device and possibly OS specific!
#ifdef RW_PS2
	engine->device = ps2::renderdevice;
#elif RW_GL3
	engine->device = gl3::renderdevice;
#elif RW_D3D9
	engine->device = d3d::renderdevice;
#else
	engine->device = null::renderdevice;
#endif

	engine->device.system(DEVICEOPEN, (void*)p, 0);

	engine->dummyDefaultPipeline = ObjPipeline::create();
	for(uint i = 0; i < NUM_PLATFORMS; i++){
		rw::engine->driver[i] = (Driver*)rwNew(Driver::s_plglist[i].size,
			MEMDUR_GLOBAL);

		engine->driver[i]->defaultPipeline = engine->dummyDefaultPipeline;

		engine->driver[i]->rasterCreate = null::rasterCreate;
		engine->driver[i]->rasterLock = null::rasterLock;
		engine->driver[i]->rasterUnlock = null::rasterUnlock;
		engine->driver[i]->rasterLockPalette = null::rasterLockPalette;
		engine->driver[i]->rasterUnlockPalette = null::rasterUnlockPalette;
		engine->driver[i]->rasterNumLevels = null::rasterNumLevels;
		engine->driver[i]->imageFindRasterFormat = null::imageFindRasterFormat;
		engine->driver[i]->rasterFromImage = null::rasterFromImage;
		engine->driver[i]->rasterToImage = null::rasterToImage;
	}

	Engine::state = Opened;
	return 1;
}